

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_mul_restartable_internal
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  byte *pbVar1;
  size_t sVar2;
  undefined8 Y;
  int iVar3;
  mbedtls_ecp_point *P_00;
  mbedtls_ecp_point *P_01;
  mbedtls_ecp_point *pmVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uchar i;
  byte bVar8;
  ulong uVar10;
  ulong uVar11;
  ulong pos;
  long lVar12;
  ulong uVar13;
  uchar uStack_179;
  mbedtls_mpi local_178 [9];
  undefined1 local_e8 [8];
  mbedtls_mpi M;
  undefined1 local_a8 [8];
  mbedtls_ecp_point Txi;
  ulong local_48;
  uchar local_31;
  mbedtls_mpi *pmVar9;
  
  pmVar9 = (mbedtls_mpi *)f_rng;
  iVar3 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar3 != 0) {
    return iVar3;
  }
  Txi.Z._8_8_ = m;
  iVar3 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar3 != 0) {
    return iVar3;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  sVar2 = grp->nbits;
  P_00 = (mbedtls_ecp_point *)calloc(2,0x30);
  if (P_00 == (mbedtls_ecp_point *)0x0) {
    iVar3 = -0x4d80;
    P_00 = (mbedtls_ecp_point *)0x0;
    goto LAB_0021fcc0;
  }
  uVar10 = sVar2 + 1;
  uVar11 = uVar10 >> 1;
  lVar12 = 1;
  pmVar4 = P_00;
  do {
    mbedtls_mpi_init(&pmVar4->X);
    mbedtls_mpi_init(&pmVar4->Y);
    mbedtls_mpi_init(&pmVar4->Z);
    pmVar4 = pmVar4 + 1;
    lVar12 = lVar12 + -1;
  } while (lVar12 == 0);
  lVar12 = 0;
  do {
    mbedtls_mpi_init((mbedtls_mpi *)((long)&local_178[0].p + lVar12));
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  iVar3 = mbedtls_ecp_copy(P_00,P);
  if (iVar3 == 0) {
    if (1 < uVar10) {
      pmVar4 = P_00 + 1;
      uVar13 = 0;
      do {
        if (((uVar13 == 0) && (iVar3 = mbedtls_ecp_copy(pmVar4,P_00), iVar3 != 0)) ||
           (iVar3 = ecp_double_jac(grp,pmVar4,pmVar4,local_178), iVar3 != 0)) goto LAB_0021faed;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
    pmVar4 = P_00 + 1;
    iVar3 = ecp_normalize_jac(grp,pmVar4);
    if (iVar3 == 0) {
      lVar12 = -2;
      P_01 = P_00;
      do {
        lVar12 = lVar12 + 1;
        if (lVar12 == 0) {
          iVar3 = ecp_normalize_jac(grp,pmVar4);
          if (iVar3 == 0) {
            iVar3 = 0;
            lVar12 = 0;
            do {
              mbedtls_mpi_free((mbedtls_mpi *)((long)&(P_00->Z).p + lVar12));
              lVar12 = lVar12 + 0x30;
            } while (lVar12 == 0x30);
          }
          break;
        }
        pmVar9 = local_178;
        iVar3 = ecp_add_mixed(grp,P_01 + 1,P_01,pmVar4,local_178);
        P_01 = P_01 + -1;
      } while (iVar3 == 0);
    }
  }
LAB_0021faed:
  lVar12 = 0;
  do {
    mbedtls_mpi_free((mbedtls_mpi *)((long)&local_178[0].p + lVar12));
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  if (iVar3 != 0) goto LAB_0021fcc0;
  mbedtls_mpi_init((mbedtls_mpi *)local_e8);
  mbedtls_mpi_init((mbedtls_mpi *)local_a8);
  iVar3 = mbedtls_mpi_get_bit(&grp->N,0);
  Y = Txi.Z._8_8_;
  if (iVar3 == 1) {
    iVar3 = mbedtls_mpi_get_bit((mbedtls_mpi *)Txi.Z._8_8_,0);
    local_31 = iVar3 == 0;
    iVar3 = mbedtls_mpi_copy((mbedtls_mpi *)local_e8,(mbedtls_mpi *)Y);
    if (((iVar3 == 0) &&
        (iVar3 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_a8,&grp->N,(mbedtls_mpi *)Y), iVar3 == 0))
       && (iVar3 = mbedtls_mpi_safe_cond_assign
                             ((mbedtls_mpi *)local_e8,(mbedtls_mpi *)local_a8,local_31), iVar3 == 0)
       ) {
      iVar3 = 0;
      memset(local_178,0,uVar11 + 1);
      if (1 < uVar10) {
        uVar13 = 0;
        do {
          lVar12 = 0;
          pos = uVar13;
          do {
            iVar3 = mbedtls_mpi_get_bit((mbedtls_mpi *)local_e8,pos);
            pbVar1 = (byte *)((long)&local_178[0].p + uVar13);
            *pbVar1 = *pbVar1 | (byte)(iVar3 << ((byte)lVar12 & 0x1f));
            lVar12 = lVar12 + 1;
            pos = pos + uVar11;
          } while (lVar12 == 1);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
        iVar3 = 0;
        uVar13 = 0;
        bVar7 = 0;
        do {
          bVar5 = *(byte *)((long)&local_178[0].p + uVar13 + 1);
          bVar8 = bVar5 & bVar7;
          pmVar9 = (mbedtls_mpi *)(ulong)bVar8;
          bVar5 = bVar5 ^ bVar7;
          bVar6 = (~bVar5 & 1) * (byte)local_178[0].p;
          bVar7 = bVar6 & bVar5 | bVar8;
          bVar6 = bVar5 ^ bVar6;
          *(byte *)((long)&local_178[0].p + uVar13 + 1) = bVar6;
          *(byte *)((long)&local_178[0].p + uVar13) = ~bVar5 << 7 | (byte)local_178[0].p;
          uVar13 = uVar13 + 1;
          local_178[0].p._0_1_ = bVar6;
        } while (uVar11 != uVar13);
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)local_a8);
    mbedtls_mpi_free((mbedtls_mpi *)local_e8);
  }
  else {
    iVar3 = -0x4f80;
  }
  if (iVar3 != 0) goto LAB_0021fcc0;
  mbedtls_mpi_init((mbedtls_mpi *)local_a8);
  mbedtls_mpi_init((mbedtls_mpi *)&Txi.X.s);
  mbedtls_mpi_init((mbedtls_mpi *)&Txi.Y.s);
  lVar12 = 0;
  do {
    mbedtls_mpi_init((mbedtls_mpi *)(local_e8 + lVar12));
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  iVar3 = ecp_select_comb(grp,R,P_00,*(uchar *)((long)&local_178[0].p + uVar11),(uchar)pmVar9);
  if (iVar3 == 0) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      iVar3 = 0;
      if (1 < uVar10) goto LAB_0021fd74;
    }
    else {
      iVar3 = ecp_randomize_jac(grp,R,f_rng,p_rng);
      if (1 < uVar10 && iVar3 == 0) {
LAB_0021fd74:
        while( true ) {
          local_48 = uVar11 - 1;
          i = (uchar)pmVar9;
          iVar3 = ecp_double_jac(grp,R,R,(mbedtls_mpi *)local_e8);
          if ((iVar3 != 0) ||
             (iVar3 = ecp_select_comb(grp,(mbedtls_ecp_point *)local_a8,P_00,(&uStack_179)[uVar11],i
                                     ), iVar3 != 0)) break;
          pmVar9 = (mbedtls_mpi *)local_e8;
          iVar3 = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)local_a8,(mbedtls_mpi *)local_e8);
          if ((iVar3 != 0) || (uVar11 = local_48, local_48 == 0)) break;
        }
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_a8);
  mbedtls_mpi_free((mbedtls_mpi *)&Txi.X.s);
  mbedtls_mpi_free((mbedtls_mpi *)&Txi.Y.s);
  lVar12 = 0;
  do {
    mbedtls_mpi_free((mbedtls_mpi *)(local_e8 + lVar12));
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  if (((iVar3 == 0) && (iVar3 = ecp_safe_invert_jac(grp,R,local_31), iVar3 == 0)) &&
     ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
      (iVar3 = ecp_randomize_jac(grp,R,f_rng,p_rng), iVar3 == 0)))) {
    iVar3 = ecp_normalize_jac(grp,R);
  }
LAB_0021fcc0:
  if ((P_00 != (mbedtls_ecp_point *)0x0) && (P_00 != grp->T)) {
    lVar12 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).p + lVar12));
      lVar12 = lVar12 + 0x30;
    } while (lVar12 == 0x30);
    free(P_00);
  }
  if (iVar3 != 0) {
    mbedtls_ecp_point_free(R);
  }
  return iVar3;
}

Assistant:

static int ecp_mul_restartable_internal(mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                                        const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                                        int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
                                        mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* reset ops count for this call if top-level */
    if (rs_ctx != NULL && rs_ctx->depth++ == 0) {
        rs_ctx->ops_done = 0;
    }
#else
    (void) rs_ctx;
#endif

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ((is_grp_capable = mbedtls_internal_ecp_grp_capable(grp))) {
        MBEDTLS_MPI_CHK(mbedtls_internal_ecp_init(grp));
    }
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

    int restarting = 0;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    restarting = (rs_ctx != NULL && rs_ctx->rsm != NULL);
#endif
    /* skip argument check when restarting */
    if (!restarting) {
        /* check_privkey is free */
        MBEDTLS_ECP_BUDGET(MBEDTLS_ECP_OPS_CHK);

        /* Common sanity checks */
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_privkey(grp, m));
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
    }

    ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        MBEDTLS_MPI_CHK(ecp_mul_mxz(grp, R, m, P, f_rng, p_rng));
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        MBEDTLS_MPI_CHK(ecp_mul_comb(grp, R, m, P, f_rng, p_rng, rs_ctx));
    }
#endif

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if (is_grp_capable) {
        mbedtls_internal_ecp_free(grp);
    }
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL) {
        rs_ctx->depth--;
    }
#endif

    return ret;
}